

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

int __thiscall ncnn::Extractor::extract(Extractor *this,int blob_index,Mat *feat,int type)

{
  long lVar1;
  int *piVar2;
  size_type sVar3;
  reference pvVar4;
  vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *this_00;
  const_reference pvVar5;
  ulong uVar6;
  int in_ECX;
  reference in_RDX;
  int in_ESI;
  long in_RDI;
  void *in_R8;
  bool bVar7;
  Mat feat_fp32_1;
  Mat feat_fp32;
  Mat bottom_blob_unpacked;
  int layer_index;
  int ret;
  int old_flush_denormals;
  int old_blocktime;
  Option *in_stack_fffffffffffffb28;
  undefined4 in_stack_fffffffffffffb30;
  int in_stack_fffffffffffffb34;
  Mat *in_stack_fffffffffffffb38;
  Mat *in_stack_fffffffffffffb40;
  value_type *pvVar8;
  int local_49c;
  Option *in_stack_fffffffffffffb70;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_fffffffffffffb78;
  undefined8 in_stack_fffffffffffffb80;
  int layer_index_00;
  NetPrivate *in_stack_fffffffffffffb88;
  reference pvVar9;
  int local_464;
  Mat local_3e8;
  value_type local_3a0;
  value_type local_358;
  uint local_310;
  value_type local_300;
  int local_2b4;
  int local_2b0;
  int local_2ac;
  int local_2a8;
  int local_2a4;
  reference local_2a0;
  int local_294;
  int local_284;
  reference local_280;
  reference local_278;
  value_type *local_270;
  value_type *local_268;
  value_type *local_260;
  int local_258;
  undefined4 local_254;
  reference local_250;
  reference local_248;
  int local_238;
  undefined4 local_234;
  reference local_230;
  reference local_228;
  int local_218;
  undefined4 local_214;
  reference local_210;
  reference local_208;
  int local_1f8;
  undefined4 local_1f4;
  reference local_1f0;
  reference local_1e8;
  int local_1d8;
  undefined4 local_1d4;
  reference local_1d0;
  reference local_1c8;
  value_type *local_1b8;
  value_type *local_1a8;
  value_type *local_198;
  Mat *local_188;
  reference local_178;
  reference local_170;
  reference local_168;
  reference local_160;
  int local_148;
  undefined4 local_144;
  Mat *local_140;
  int local_128;
  undefined4 local_124;
  value_type *local_120;
  int local_108;
  undefined4 local_104;
  value_type *local_100;
  int local_e8;
  undefined4 local_e4;
  value_type *local_e0;
  int local_d8;
  undefined4 local_d4;
  reference local_d0;
  int local_c8;
  undefined4 local_c4;
  reference local_c0;
  int local_b8;
  undefined4 local_b4;
  reference local_b0;
  int local_a8;
  undefined4 local_a4;
  reference local_a0;
  int local_98;
  undefined4 local_94;
  reference local_90;
  reference local_88;
  reference local_80;
  reference local_78;
  reference local_70;
  void *local_68;
  void *local_60;
  void *local_58;
  void *local_50;
  void *local_48;
  void *local_40;
  void *local_30;
  void *local_20;
  
  layer_index_00 = (int)((ulong)in_stack_fffffffffffffb80 >> 0x20);
  if ((in_ESI < 0) ||
     (local_2a4 = in_ECX, local_2a0 = in_RDX, local_294 = in_ESI,
     sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size
                       ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)(*(long *)(in_RDI + 8) + 8)
                       ), (int)sVar3 <= in_ESI)) {
    local_284 = -1;
  }
  else {
    local_2a8 = get_kmp_blocktime();
    set_kmp_blocktime(*(int *)(*(long *)(in_RDI + 8) + 0x38));
    local_2ac = get_flush_denormals();
    set_flush_denormals(0x161634);
    local_2b0 = 0;
    pvVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                       ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)(*(long *)(in_RDI + 8) + 8)
                        ,(long)local_294);
    if (pvVar4->dims == 0) {
      this_00 = Net::blobs((Net *)**(undefined8 **)(in_RDI + 8));
      pvVar5 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                         (this_00,(long)local_294);
      local_2b4 = pvVar5->producer;
      if ((*(byte *)(*(long *)(in_RDI + 8) + 0x54) & 1) != 0) {
        if (*(long *)(*(long *)(in_RDI + 8) + 0x28) == 0) {
          *(undefined8 *)(*(long *)(in_RDI + 8) + 0x28) =
               *(undefined8 *)(*(long *)(**(long **)(in_RDI + 8) + 0x48) + 200);
        }
        if (*(long *)(*(long *)(in_RDI + 8) + 0x30) == 0) {
          *(undefined8 *)(*(long *)(in_RDI + 8) + 0x30) =
               *(undefined8 *)(*(long *)(**(long **)(in_RDI + 8) + 0x48) + 0xd0);
        }
      }
      local_2b0 = NetPrivate::forward_layer
                            (in_stack_fffffffffffffb88,layer_index_00,in_stack_fffffffffffffb78,
                             in_stack_fffffffffffffb70);
    }
    local_1d0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                          ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                           (*(long *)(in_RDI + 8) + 8),(long)local_294);
    pvVar4 = local_2a0;
    local_1c8 = local_2a0;
    if (local_2a0 != local_1d0) {
      if (local_1d0->refcount != (int *)0x0) {
        piVar2 = local_1d0->refcount;
        local_1d4 = 1;
        LOCK();
        local_1d8 = *piVar2;
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      local_d0 = local_2a0;
      if (local_2a0->refcount != (int *)0x0) {
        piVar2 = local_2a0->refcount;
        local_d4 = 0xffffffff;
        LOCK();
        local_d8 = *piVar2;
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (local_d8 == 1) {
          if (local_2a0->allocator == (Allocator *)0x0) {
            local_48 = local_2a0->data;
            if (local_48 != (void *)0x0) {
              free(local_48);
            }
          }
          else {
            (*local_2a0->allocator->_vptr_Allocator[3])(local_2a0->allocator,local_2a0->data);
          }
        }
      }
      pvVar4->data = (void *)0x0;
      pvVar4->elemsize = 0;
      pvVar4->elempack = 0;
      pvVar4->dims = 0;
      pvVar4->w = 0;
      pvVar4->h = 0;
      pvVar4->d = 0;
      pvVar4->c = 0;
      pvVar4->cstep = 0;
      pvVar4->refcount = (int *)0x0;
      pvVar4->data = local_1d0->data;
      pvVar4->refcount = local_1d0->refcount;
      pvVar4->elemsize = local_1d0->elemsize;
      pvVar4->elempack = local_1d0->elempack;
      pvVar4->allocator = local_1d0->allocator;
      pvVar4->dims = local_1d0->dims;
      pvVar4->w = local_1d0->w;
      pvVar4->h = local_1d0->h;
      pvVar4->d = local_1d0->d;
      pvVar4->c = local_1d0->c;
      pvVar4->cstep = local_1d0->cstep;
    }
    local_160 = local_2a0;
    bVar7 = true;
    if (local_2a0->data != (void *)0x0) {
      local_88 = local_2a0;
      bVar7 = local_2a0->cstep * (long)local_2a0->c == 0;
    }
    if (!bVar7) {
      if ((((*(byte *)(*(long *)(in_RDI + 8) + 0x47) & 1) != 0) && (local_2a4 == 0)) &&
         (local_2a0->elempack != 1)) {
        local_270 = &local_300;
        local_300.data = (void *)0x0;
        local_300.refcount = (int *)0x0;
        local_300.elemsize = 0;
        local_300.elempack = 0;
        local_300.allocator = (Allocator *)0x0;
        local_300.dims = 0;
        local_300.w = 0;
        local_300.h = 0;
        local_300.d = 0;
        local_300.c = 0;
        local_300.cstep = 0;
        convert_packing(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,
                        in_stack_fffffffffffffb34,in_stack_fffffffffffffb28);
        pvVar4 = local_2a0;
        local_1e8 = local_2a0;
        local_1f0 = &local_300;
        if (local_2a0 != local_1f0) {
          if (local_300.refcount != (int *)0x0) {
            local_1f4 = 1;
            LOCK();
            local_1f8 = *local_300.refcount;
            *local_300.refcount = *local_300.refcount + 1;
            UNLOCK();
          }
          local_c0 = local_2a0;
          if (local_2a0->refcount != (int *)0x0) {
            piVar2 = local_2a0->refcount;
            local_c4 = 0xffffffff;
            LOCK();
            local_c8 = *piVar2;
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (local_c8 == 1) {
              if (local_2a0->allocator == (Allocator *)0x0) {
                local_50 = local_2a0->data;
                if (local_50 != (void *)0x0) {
                  free(local_50);
                }
              }
              else {
                (*local_2a0->allocator->_vptr_Allocator[3])(local_2a0->allocator,local_2a0->data);
              }
            }
          }
          pvVar4->data = (void *)0x0;
          pvVar4->elemsize = 0;
          pvVar4->elempack = 0;
          pvVar4->dims = 0;
          pvVar4->w = 0;
          pvVar4->h = 0;
          pvVar4->d = 0;
          pvVar4->c = 0;
          pvVar4->cstep = 0;
          pvVar4->refcount = (int *)0x0;
          pvVar4->data = local_1f0->data;
          pvVar4->refcount = local_1f0->refcount;
          pvVar4->elemsize = local_1f0->elemsize;
          pvVar4->elempack = local_1f0->elempack;
          pvVar4->allocator = local_1f0->allocator;
          pvVar4->dims = local_1f0->dims;
          pvVar4->w = local_1f0->w;
          pvVar4->h = local_1f0->h;
          pvVar4->d = local_1f0->d;
          pvVar4->c = local_1f0->c;
          pvVar4->cstep = local_1f0->cstep;
        }
        local_168 = local_2a0;
        bVar7 = true;
        if (local_2a0->data != (void *)0x0) {
          local_80 = local_2a0;
          bVar7 = local_2a0->cstep * (long)local_2a0->c == 0;
        }
        if (bVar7) {
          local_284 = -100;
        }
        local_310 = (uint)bVar7;
        local_1b8 = &local_300;
        local_e0 = local_1b8;
        if (local_300.refcount != (int *)0x0) {
          local_e4 = 0xffffffff;
          LOCK();
          local_e8 = *local_300.refcount;
          *local_300.refcount = *local_300.refcount + -1;
          UNLOCK();
          if (local_e8 == 1) {
            if (local_300.allocator == (Allocator *)0x0) {
              local_40 = local_300.data;
              if (local_300.data != (void *)0x0) {
                free(local_300.data);
              }
            }
            else {
              (*(local_300.allocator)->_vptr_Allocator[3])(local_300.allocator,local_300.data);
            }
          }
        }
        local_300.data = (void *)0x0;
        local_300.elemsize = 0;
        local_300.elempack = 0;
        local_300.dims = 0;
        local_300.w = 0;
        local_300.h = 0;
        local_300.d = 0;
        local_300.c = 0;
        local_300.cstep = 0;
        local_300.refcount = (int *)0x0;
        if (local_310 != 0) {
          return local_284;
        }
      }
      if (((*(byte *)(*(long *)(in_RDI + 8) + 0x40) & 1) == 0) || (local_2a4 != 0)) {
        local_280 = local_2a0;
        if (local_2a0->elempack == 0) {
          local_49c = 0;
        }
        else {
          uVar6 = local_2a0->elemsize << 3;
          local_49c = (int)((long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) /
                           (long)local_2a0->elempack);
        }
        if ((local_49c == 8) && (local_2a4 == 0)) {
          local_260 = &local_3a0;
          local_3a0.data = (void *)0x0;
          local_3a0.refcount = (int *)0x0;
          local_3a0.elemsize = 0;
          local_3a0.elempack = 0;
          local_3a0.allocator = (Allocator *)0x0;
          local_3a0.dims = 0;
          local_3a0.w = 0;
          local_3a0.h = 0;
          local_3a0.d = 0;
          local_3a0.c = 0;
          local_3a0.cstep = 0;
          cast_int8_to_float32
                    (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,
                     (Option *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
          pvVar4 = local_2a0;
          local_228 = local_2a0;
          local_230 = &local_3a0;
          if (local_2a0 != local_230) {
            if (local_3a0.refcount != (int *)0x0) {
              local_234 = 1;
              LOCK();
              local_238 = *local_3a0.refcount;
              *local_3a0.refcount = *local_3a0.refcount + 1;
              UNLOCK();
            }
            local_a0 = local_2a0;
            if (local_2a0->refcount != (int *)0x0) {
              piVar2 = local_2a0->refcount;
              local_a4 = 0xffffffff;
              LOCK();
              local_a8 = *piVar2;
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (local_a8 == 1) {
                if (local_2a0->allocator == (Allocator *)0x0) {
                  local_60 = local_2a0->data;
                  if (local_60 != (void *)0x0) {
                    free(local_60);
                  }
                }
                else {
                  (*local_2a0->allocator->_vptr_Allocator[3])(local_2a0->allocator,local_2a0->data);
                }
              }
            }
            pvVar4->data = (void *)0x0;
            pvVar4->elemsize = 0;
            pvVar4->elempack = 0;
            pvVar4->dims = 0;
            pvVar4->w = 0;
            pvVar4->h = 0;
            pvVar4->d = 0;
            pvVar4->c = 0;
            pvVar4->cstep = 0;
            pvVar4->refcount = (int *)0x0;
            pvVar4->data = local_230->data;
            pvVar4->refcount = local_230->refcount;
            pvVar4->elemsize = local_230->elemsize;
            pvVar4->elempack = local_230->elempack;
            pvVar4->allocator = local_230->allocator;
            pvVar4->dims = local_230->dims;
            pvVar4->w = local_230->w;
            pvVar4->h = local_230->h;
            pvVar4->d = local_230->d;
            pvVar4->c = local_230->c;
            pvVar4->cstep = local_230->cstep;
          }
          pvVar8 = &local_3a0;
          local_198 = pvVar8;
          local_120 = pvVar8;
          if (local_3a0.refcount != (int *)0x0) {
            local_124 = 0xffffffff;
            LOCK();
            local_128 = *local_3a0.refcount;
            *local_3a0.refcount = *local_3a0.refcount + -1;
            UNLOCK();
            if (local_128 == 1) {
              if (local_3a0.allocator == (Allocator *)0x0) {
                local_20 = local_3a0.data;
                if (local_3a0.data != (void *)0x0) {
                  free(local_3a0.data);
                }
              }
              else {
                (*(local_3a0.allocator)->_vptr_Allocator[3])(local_3a0.allocator,local_3a0.data);
              }
            }
          }
          pvVar8->data = (void *)0x0;
          pvVar8->elemsize = 0;
          pvVar8->elempack = 0;
          pvVar8->dims = 0;
          pvVar8->w = 0;
          pvVar8->h = 0;
          pvVar8->d = 0;
          pvVar8->c = 0;
          pvVar8->cstep = 0;
          pvVar8->refcount = (int *)0x0;
        }
      }
      else {
        local_278 = local_2a0;
        if (local_2a0->elempack == 0) {
          local_464 = 0;
        }
        else {
          uVar6 = local_2a0->elemsize << 3;
          local_464 = (int)((long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) /
                           (long)local_2a0->elempack);
        }
        if (local_464 == 0x10) {
          local_268 = &local_358;
          local_358.data = (void *)0x0;
          local_358.refcount = (int *)0x0;
          local_358.elemsize = 0;
          local_358.elempack = 0;
          local_358.allocator = (Allocator *)0x0;
          local_358.dims = 0;
          local_358.w = 0;
          local_358.h = 0;
          local_358.d = 0;
          local_358.c = 0;
          local_358.cstep = 0;
          cast_bfloat16_to_float32
                    (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,
                     (Option *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
          local_208 = local_2a0;
          local_210 = &local_358;
          if (local_2a0 != local_210) {
            if (local_358.refcount != (int *)0x0) {
              local_214 = 1;
              LOCK();
              local_218 = *local_358.refcount;
              *local_358.refcount = *local_358.refcount + 1;
              UNLOCK();
            }
            local_b0 = local_2a0;
            pvVar4 = local_2a0;
            pvVar9 = local_2a0;
            if (local_2a0->refcount != (int *)0x0) {
              piVar2 = local_2a0->refcount;
              local_b4 = 0xffffffff;
              LOCK();
              local_b8 = *piVar2;
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (local_b8 == 1) {
                if (local_2a0->allocator == (Allocator *)0x0) {
                  local_58 = local_2a0->data;
                  if (local_58 != (void *)0x0) {
                    free(local_58);
                  }
                }
                else {
                  (*local_2a0->allocator->_vptr_Allocator[3])(local_2a0->allocator,local_2a0->data);
                }
              }
            }
            pvVar4->data = (void *)0x0;
            pvVar4->elemsize = 0;
            pvVar4->elempack = 0;
            pvVar4->dims = 0;
            pvVar4->w = 0;
            pvVar4->h = 0;
            pvVar4->d = 0;
            pvVar4->c = 0;
            pvVar4->cstep = 0;
            pvVar4->refcount = (int *)0x0;
            pvVar9->data = local_210->data;
            pvVar9->refcount = local_210->refcount;
            pvVar9->elemsize = local_210->elemsize;
            pvVar9->elempack = local_210->elempack;
            pvVar9->allocator = local_210->allocator;
            pvVar9->dims = local_210->dims;
            pvVar9->w = local_210->w;
            pvVar9->h = local_210->h;
            pvVar9->d = local_210->d;
            pvVar9->c = local_210->c;
            pvVar9->cstep = local_210->cstep;
          }
          pvVar8 = &local_358;
          local_1a8 = pvVar8;
          local_100 = pvVar8;
          if (local_358.refcount != (int *)0x0) {
            local_104 = 0xffffffff;
            LOCK();
            local_108 = *local_358.refcount;
            *local_358.refcount = *local_358.refcount + -1;
            UNLOCK();
            if (local_108 == 1) {
              if (local_358.allocator == (Allocator *)0x0) {
                local_30 = local_358.data;
                if (local_358.data != (void *)0x0) {
                  free(local_358.data);
                }
              }
              else {
                (*(local_358.allocator)->_vptr_Allocator[3])(local_358.allocator,local_358.data);
              }
            }
          }
          pvVar8->data = (void *)0x0;
          pvVar8->elemsize = 0;
          pvVar8->elempack = 0;
          pvVar8->dims = 0;
          pvVar8->w = 0;
          pvVar8->h = 0;
          pvVar8->d = 0;
          pvVar8->c = 0;
          pvVar8->cstep = 0;
          pvVar8->refcount = (int *)0x0;
        }
      }
      local_170 = local_2a0;
      bVar7 = true;
      if (local_2a0->data != (void *)0x0) {
        local_78 = local_2a0;
        bVar7 = local_2a0->cstep * (long)local_2a0->c == 0;
      }
      if (bVar7) {
        return -100;
      }
      if (((*(byte *)(*(long *)(in_RDI + 8) + 0x54) & 1) != 0) &&
         (lVar1 = *(long *)(**(long **)(in_RDI + 8) + 0x48),
         local_2a0->allocator == *(Allocator **)(lVar1 + 200))) {
        Mat::clone(&local_3e8,(__fn *)local_2a0,(void *)0x0,(int)lVar1,in_R8);
        pvVar4 = local_2a0;
        local_248 = local_2a0;
        local_250 = &local_3e8;
        if (local_2a0 != local_250) {
          if (local_3e8.refcount != (int *)0x0) {
            local_254 = 1;
            LOCK();
            local_258 = *local_3e8.refcount;
            *local_3e8.refcount = *local_3e8.refcount + 1;
            UNLOCK();
          }
          local_90 = local_2a0;
          if (local_2a0->refcount != (int *)0x0) {
            piVar2 = local_2a0->refcount;
            local_94 = 0xffffffff;
            LOCK();
            local_98 = *piVar2;
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (local_98 == 1) {
              if (local_2a0->allocator == (Allocator *)0x0) {
                local_68 = local_2a0->data;
                if (local_68 != (void *)0x0) {
                  free(local_68);
                }
              }
              else {
                (*local_2a0->allocator->_vptr_Allocator[3])(local_2a0->allocator,local_2a0->data);
              }
            }
          }
          pvVar4->data = (void *)0x0;
          pvVar4->elemsize = 0;
          pvVar4->elempack = 0;
          pvVar4->dims = 0;
          pvVar4->w = 0;
          pvVar4->h = 0;
          pvVar4->d = 0;
          pvVar4->c = 0;
          pvVar4->cstep = 0;
          pvVar4->refcount = (int *)0x0;
          pvVar4->data = local_250->data;
          pvVar4->refcount = local_250->refcount;
          pvVar4->elemsize = local_250->elemsize;
          pvVar4->elempack = local_250->elempack;
          pvVar4->allocator = local_250->allocator;
          pvVar4->dims = local_250->dims;
          pvVar4->w = local_250->w;
          pvVar4->h = local_250->h;
          pvVar4->d = local_250->d;
          pvVar4->c = local_250->c;
          pvVar4->cstep = local_250->cstep;
        }
        local_188 = &local_3e8;
        local_140 = local_188;
        if (local_3e8.refcount != (int *)0x0) {
          local_144 = 0xffffffff;
          LOCK();
          local_148 = *local_3e8.refcount;
          *local_3e8.refcount = *local_3e8.refcount + -1;
          UNLOCK();
          if (local_148 == 1) {
            if (local_3e8.allocator == (Allocator *)0x0) {
              if (local_3e8.data != (void *)0x0) {
                free(local_3e8.data);
              }
            }
            else {
              (*(local_3e8.allocator)->_vptr_Allocator[3])(local_3e8.allocator,local_3e8.data);
            }
          }
        }
        local_3e8.data = (void *)0x0;
        local_3e8.elemsize = 0;
        local_3e8.elempack = 0;
        local_3e8.dims = 0;
        local_3e8.w = 0;
        local_3e8.h = 0;
        local_3e8.d = 0;
        local_3e8.c = 0;
        local_3e8.cstep = 0;
        local_3e8.refcount = (int *)0x0;
        local_178 = local_2a0;
        bVar7 = true;
        if (local_2a0->data != (void *)0x0) {
          local_70 = local_2a0;
          bVar7 = local_2a0->cstep * (long)local_2a0->c == 0;
        }
        if (bVar7) {
          return -100;
        }
      }
    }
    set_kmp_blocktime(local_2a8);
    set_flush_denormals(0x1630d7);
    local_284 = local_2b0;
  }
  return local_284;
}

Assistant:

int Extractor::extract(int blob_index, Mat& feat, int type)
{
    if (blob_index < 0 || blob_index >= (int)d->blob_mats.size())
        return -1;

    int old_blocktime = get_kmp_blocktime();
    set_kmp_blocktime(d->opt.openmp_blocktime);

    int old_flush_denormals = get_flush_denormals();
    set_flush_denormals(d->opt.flush_denormals);

    int ret = 0;

    if (d->blob_mats[blob_index].dims == 0)
    {
        int layer_index = d->net->blobs()[blob_index].producer;

        // use local allocator
        if (d->opt.use_local_pool_allocator)
        {
            if (!d->opt.blob_allocator)
            {
                d->opt.blob_allocator = d->net->d->local_blob_allocator;
            }
            if (!d->opt.workspace_allocator)
            {
                d->opt.workspace_allocator = d->net->d->local_workspace_allocator;
            }
        }

#if NCNN_VULKAN
        if (d->opt.use_vulkan_compute)
        {
            // use local allocator
            if (!d->opt.blob_vkallocator)
            {
                d->local_blob_vkallocator = d->net->vulkan_device()->acquire_blob_allocator();
                d->opt.blob_vkallocator = d->local_blob_vkallocator;
            }
            if (!d->opt.workspace_vkallocator)
            {
                d->opt.workspace_vkallocator = d->opt.blob_vkallocator;
            }
            if (!d->opt.staging_vkallocator)
            {
                d->local_staging_vkallocator = d->net->vulkan_device()->acquire_staging_allocator();
                d->opt.staging_vkallocator = d->local_staging_vkallocator;
            }

            ncnn::VkCompute cmd(d->net->vulkan_device());
#if NCNN_BENCHMARK
            cmd.create_query_pool(d->net->layers().size() * 2);
#endif // NCNN_BENCHMARK

            // TODO vkimagemat for adreno
            if (d->opt.use_image_storage)
            {
                VkImageMat feat_gpu;
                ret = extract(blob_index, feat_gpu, cmd);

                if (ret == 0 && d->blob_mats[blob_index].dims == 0 && feat_gpu.dims != 0)
                {
                    cmd.record_download(feat_gpu, d->blob_mats[blob_index], d->opt);

                    ret = cmd.submit_and_wait();

#if NCNN_BENCHMARK
                    std::vector<uint64_t> results(d->net->layers().size() * 2);
                    cmd.get_query_pool_results(0, d->net->layers().size() * 2, results);
                    for (size_t i = 0; i < d->net->layers().size(); i++)
                    {
                        uint64_t start = results[i * 2];
                        uint64_t end = results[i * 2 + 1];
                        if (start == 0 || end == 0)
                            continue;

                        double duration_us = (end - start) * d->net->vulkan_device()->info.timestamp_period() / 1000;
                        NCNN_LOGE("%-24s %-30s %8.2lfus    |", d->net->layers()[i]->type.c_str(), d->net->layers()[i]->name.c_str(), duration_us);
                    }
#endif // NCNN_BENCHMARK
                }
            }
            else
            {
                VkMat feat_gpu;
                ret = extract(blob_index, feat_gpu, cmd);

                if (ret == 0 && d->blob_mats[blob_index].dims == 0 && feat_gpu.dims != 0)
                {
                    cmd.record_download(feat_gpu, d->blob_mats[blob_index], d->opt);

                    ret = cmd.submit_and_wait();

#if NCNN_BENCHMARK
                    std::vector<uint64_t> results(d->net->layers().size() * 2);
                    cmd.get_query_pool_results(0, d->net->layers().size() * 2, results);
                    for (size_t i = 0; i < d->net->layers().size(); i++)
                    {
                        uint64_t start = results[i * 2];
                        uint64_t end = results[i * 2 + 1];
                        if (start == 0 || end == 0)
                            continue;

                        double duration_us = (end - start) * d->net->vulkan_device()->info.timestamp_period() / 1000;
                        NCNN_LOGE("%-24s %-30s %8.2lfus    |", d->net->layers()[i]->type.c_str(), d->net->layers()[i]->name.c_str(), duration_us);
                    }
#endif // NCNN_BENCHMARK
                }
            }
        }
        else
        {
            ret = d->net->d->forward_layer(layer_index, d->blob_mats, d->opt);
        }
#else
        ret = d->net->d->forward_layer(layer_index, d->blob_mats, d->opt);
#endif // NCNN_VULKAN
    }

    feat = d->blob_mats[blob_index];

    // empty is valid for outputs
    if (!feat.empty())
    {
        if (d->opt.use_packing_layout && (type == 0) && feat.elempack != 1)
        {
            Mat bottom_blob_unpacked;
            convert_packing(feat, bottom_blob_unpacked, 1, d->opt);
            feat = bottom_blob_unpacked;
            if (feat.empty())
                return -100;
        }

        // clang-format off
        // *INDENT-OFF*
#if NCNN_ARM82
        if (d->opt.use_fp16_storage && cpu_support_arm_asimdhp() && (type == 0))
        {
            if (feat.elembits() == 16)
            {
                Mat feat_fp32;
                cast_float16_to_float32(feat, feat_fp32, d->opt);
                feat = feat_fp32;
            }
        }
        else
#endif // NCNN_ARM82
#if NCNN_VFPV4
        if (d->opt.use_fp16_storage && !d->opt.use_bf16_storage && cpu_support_arm_vfpv4() && (type == 0))
        {
            if (feat.elembits() == 16)
            {
                Mat feat_fp32;
                cast_float16_to_float32(feat, feat_fp32, d->opt);
                feat = feat_fp32;
            }
        }
        else
#endif // NCNN_VFPV4
#if NCNN_ZVFH
        if (d->opt.use_fp16_storage && cpu_support_riscv_zvfh() && (type == 0))
        {
            if (feat.elembits() == 16)
            {
                Mat feat_fp32;
                cast_float16_to_float32(feat, feat_fp32, d->opt);
                feat = feat_fp32;
            }
        }
        else
#endif // NCNN_ZVFH
#if NCNN_BF16
        if (d->opt.use_bf16_storage && (type == 0))
        {
            if (feat.elembits() == 16)
            {
                Mat feat_fp32;
                cast_bfloat16_to_float32(feat, feat_fp32, d->opt);
                feat = feat_fp32;
            }
        }
        else
#endif // NCNN_BF16
        if (feat.elembits() == 8 && (type == 0))
        {
            Mat feat_fp32;
            cast_int8_to_float32(feat, feat_fp32, d->opt);
            feat = feat_fp32;
        }
        // *INDENT-ON*
        // clang-format on
        if (feat.empty())
            return -100;

        if (d->opt.use_local_pool_allocator && feat.allocator == d->net->d->local_blob_allocator)
        {
            // detach the returned mat from local pool allocator
            // so we could destroy net instance much earlier
            feat = feat.clone();
            if (feat.empty())
                return -100;
        }
    }

    set_kmp_blocktime(old_blocktime);
    set_flush_denormals(old_flush_denormals);

    return ret;
}